

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tsip.cpp
# Opt level: O0

bool __thiscall tsip::send_request_msg(tsip *this,_command_packet _cmd)

{
  size_t sVar1;
  long in_RDI;
  int k;
  int byte_cnt;
  int j;
  int x;
  uchar buffer [256];
  int local_118;
  int local_110;
  int local_10c;
  byte local_108 [264];
  
  local_108[0] = 0x10;
  local_10c = 1;
  for (local_110 = 0; local_110 < (int)(uint)buffer[0x28]; local_110 = local_110 + 1) {
    local_108[local_10c] = buffer[(long)local_110 + -0x18];
    local_10c = local_10c + 1;
  }
  local_108[local_10c] = 0x10;
  local_108[local_10c + 1] = 3;
  sVar1 = fwrite(local_108,1,(long)(local_10c + 1),*(FILE **)(in_RDI + 0x9e8));
  if ((*(byte *)(in_RDI + 0x9c0) & 1) != 0) {
    printf("Sending Request: ");
    for (local_118 = 0; local_118 <= local_10c + 1; local_118 = local_118 + 1) {
      printf(" %x",(ulong)local_108[local_118]);
    }
    printf("\n");
  }
  return (bool)(-((int)sVar1 == local_10c + 1) & 1);
}

Assistant:

bool tsip::send_request_msg(_command_packet _cmd) {

	unsigned char buffer[256];
	buffer[0] = DLE;
	int x = 1;
	for (int j=0; j < _cmd.raw.cmd_len; j++,x++){
		buffer[x] = _cmd.raw.data[j];
	}
	buffer[x] = DLE;
	buffer[x+1] = ETX;
	int byte_cnt = fwrite(buffer, 1, x+1, file);
	if (verbose) {
		printf("Sending Request: ");
		for (int k=0;k<=x+1;k++){printf(" %x",buffer[k]);}
		printf("\n");
	}

	return (byte_cnt == x+1 ? true : false);
}